

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::Fetch
          (RowGroupCollection *this,TransactionData transaction,DataChunk *result,
          vector<duckdb::StorageIndex,_true> *column_ids,Vector *row_identifiers,idx_t fetch_count,
          ColumnFetchState *state)

{
  data_ptr_t pdVar1;
  idx_t row_number;
  bool bVar2;
  RowGroupSegmentTree *pRVar3;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *this_00;
  idx_t iVar4;
  RowGroup *unaff_R15;
  idx_t segment_index;
  SegmentLock l;
  idx_t local_80;
  idx_t local_48;
  unique_lock<std::mutex> local_40;
  
  pdVar1 = row_identifiers->data;
  this_00 = &this->row_groups;
  local_80 = 0;
  for (iVar4 = 0; fetch_count != iVar4; iVar4 = iVar4 + 1) {
    row_number = *(idx_t *)(pdVar1 + iVar4 * 8);
    pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
    ::std::unique_lock<std::mutex>::unique_lock
              (&local_40,&(pRVar3->super_SegmentTree<duckdb::RowGroup,_true>).node_lock);
    pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
    bVar2 = SegmentTree<duckdb::RowGroup,_true>::TryGetSegmentIndex
                      (&pRVar3->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_40,
                       row_number,&local_48);
    if (bVar2) {
      pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
      unaff_R15 = SegmentTree<duckdb::RowGroup,_true>::GetSegmentByIndex
                            (&pRVar3->super_SegmentTree<duckdb::RowGroup,_true>,
                             (SegmentLock *)&local_40,local_48);
    }
    ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
    if (bVar2) {
      bVar2 = RowGroup::Fetch(unaff_R15,transaction,
                              row_number - (unaff_R15->super_SegmentBase<duckdb::RowGroup>).start);
      if (bVar2) {
        RowGroup::FetchRow(unaff_R15,transaction,state,column_ids,row_number,result,local_80);
        local_80 = local_80 + 1;
      }
    }
  }
  result->count = local_80;
  return;
}

Assistant:

void RowGroupCollection::Fetch(TransactionData transaction, DataChunk &result, const vector<StorageIndex> &column_ids,
                               const Vector &row_identifiers, idx_t fetch_count, ColumnFetchState &state) {
	// figure out which row_group to fetch from
	auto row_ids = FlatVector::GetData<row_t>(row_identifiers);
	idx_t count = 0;
	for (idx_t i = 0; i < fetch_count; i++) {
		auto row_id = row_ids[i];
		RowGroup *row_group;
		{
			idx_t segment_index;
			auto l = row_groups->Lock();
			if (!row_groups->TryGetSegmentIndex(l, UnsafeNumericCast<idx_t>(row_id), segment_index)) {
				// in parallel append scenarios it is possible for the row_id
				continue;
			}
			row_group = row_groups->GetSegmentByIndex(l, UnsafeNumericCast<int64_t>(segment_index));
		}
		if (!row_group->Fetch(transaction, UnsafeNumericCast<idx_t>(row_id) - row_group->start)) {
			continue;
		}
		row_group->FetchRow(transaction, state, column_ids, row_id, result, count);
		count++;
	}
	result.SetCardinality(count);
}